

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall booster::log::sinks::file::file(file *this,string *file_name,int mf)

{
  data *v;
  uint in_EDX;
  int __oflag;
  string *in_RSI;
  file *in_RDI;
  sink *in_stack_ffffffffffffff80;
  string local_50 [32];
  locale local_30 [3];
  uint local_14;
  string *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  sink::sink(in_stack_ffffffffffffff80);
  (in_RDI->super_sink)._vptr_sink = (_func_int **)&PTR_log_002e8cb0;
  in_RDI->max_files_ = 0;
  in_RDI->max_size_ = 0;
  in_RDI->current_size_ = 0;
  in_RDI->opened_ = false;
  in_RDI->append_ = false;
  in_RDI->use_local_time_ = true;
  in_RDI->tz_offset_ = 0;
  v = (data *)operator_new(0x210);
  memset(v,0,0x210);
  data::data((data *)0x22248c);
  hold_ptr<booster::log::sinks::file::data>::hold_ptr(&in_RDI->d,v);
  if (local_14 == 0xffffffff) {
    append(in_RDI);
  }
  else if (0 < (int)local_14) {
    max_files(in_RDI,local_14);
  }
  hold_ptr<booster::log::sinks::file::data>::operator->(&in_RDI->d);
  std::locale::classic();
  std::ios::imbue(local_30);
  std::locale::~locale(local_30);
  std::__cxx11::string::string(local_50,local_10);
  open(in_RDI,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

file::file(std::string const &file_name,int mf) :
			max_files_(0),
			max_size_(0),
			current_size_(0),
			opened_(false),
			append_(false),
			use_local_time_(true),
			tz_offset_(0),
			d(new file::data())
		{
			if(mf == app) {
				append();
			}
			else if(mf > 0) {
				max_files(mf);
			}
			d->stream.imbue(std::locale::classic());
			open(file_name);
		}